

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_bool32 drmp3_init_file(drmp3 *pMP3,char *filePath,drmp3_config *pConfig)

{
  FILE *pConfig_00;
  void *in_RDX;
  drmp3_seek_proc in_RSI;
  drmp3_read_proc in_RDI;
  FILE *pFile;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  drmp3_bool32 dVar1;
  
  pConfig_00 = fopen((char *)in_RSI,"rb");
  if (pConfig_00 == (FILE *)0x0) {
    dVar1 = 0;
  }
  else {
    dVar1 = drmp3_init((drmp3 *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                       ,in_RSI,in_RDX,(drmp3_config *)pConfig_00);
  }
  return dVar1;
}

Assistant:

drmp3_bool32 drmp3_init_file(drmp3* pMP3, const char* filePath, const drmp3_config* pConfig)
{
    FILE* pFile;
#if defined(_MSC_VER) && _MSC_VER >= 1400
    if (fopen_s(&pFile, filePath, "rb") != 0) {
        return DRMP3_FALSE;
    }
#else
    pFile = fopen(filePath, "rb");
    if (pFile == NULL) {
        return DRMP3_FALSE;
    }
#endif

    return drmp3_init(pMP3, drmp3__on_read_stdio, drmp3__on_seek_stdio, (void*)pFile, pConfig);
}